

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BrokerFactory.cpp
# Opt level: O0

bool helics::BrokerFactory::registerBroker(shared_ptr<helics::Broker> *broker,CoreType type)

{
  bool bVar1;
  element_type *peVar2;
  undefined4 in_ESI;
  string *in_RDI;
  SearchableObjectHolder<helics::Core,_helics::CoreType> *unaff_retaddr;
  string *bname;
  bool registered;
  undefined4 in_stack_ffffffffffffff28;
  CoreType in_stack_ffffffffffffff2c;
  byte bVar3;
  milliseconds in_stack_ffffffffffffff30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff40;
  undefined7 in_stack_ffffffffffffff48;
  undefined1 in_stack_ffffffffffffff4f;
  DelayedDestructor<helics::Broker> *in_stack_ffffffffffffff50;
  undefined8 uVar4;
  _Alloc_hider in_stack_ffffffffffffff68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff70;
  int local_74;
  duration<long,std::ratio<1l,1000l>> local_70 [12];
  int local_64;
  duration<long,std::ratio<1l,1000l>> local_60 [40];
  undefined8 uVar5;
  undefined4 type_00;
  uint3 in_stack_fffffffffffffff0;
  uint uVar6;
  
  uVar6 = (uint)in_stack_fffffffffffffff0;
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)in_RDI);
  if (bVar1) {
    peVar2 = CLI::std::__shared_ptr_access<helics::Broker,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<helics::Broker,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x4f709e);
    (*peVar2->_vptr_Broker[0xb])();
    std::__cxx11::string::string
              (in_stack_ffffffffffffff70,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffff68._M_p);
  }
  else {
    std::__cxx11::string::string(in_stack_ffffffffffffff40);
  }
  uVar4 = &stack0xffffffffffffffc8;
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)in_RDI);
  if (bVar1) {
    uVar5 = uVar4;
    std::shared_ptr<helics::Broker>::shared_ptr
              ((shared_ptr<helics::Broker> *)in_stack_ffffffffffffff30.__r,
               (shared_ptr<helics::Broker> *)
               CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
    bVar1 = gmlc::concurrency::SearchableObjectHolder<helics::Broker,_helics::CoreType>::addObject
                      (unaff_retaddr,in_RDI,(shared_ptr<helics::Broker> *)CONCAT44(in_ESI,uVar6),
                       (int)((ulong)uVar5 >> 0x20));
    uVar6 = CONCAT13(bVar1,(int3)uVar6);
    CLI::std::shared_ptr<helics::Broker>::~shared_ptr((shared_ptr<helics::Broker> *)0x4f7150);
    in_stack_ffffffffffffff50 = (DelayedDestructor<helics::Broker> *)uVar4;
    uVar4 = uVar5;
  }
  type_00 = (undefined4)((ulong)uVar4 >> 0x20);
  if (((uVar6 & 0x1000000) == 0) &&
     (bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)in_RDI), bVar1)) {
    local_64 = 100;
    std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>(local_60,&local_64);
    std::this_thread::sleep_for<long,std::ratio<1l,1000l>>
              ((duration<long,_std::ratio<1L,_1000L>_> *)in_stack_ffffffffffffff70);
    local_74 = 200;
    std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>(local_70,&local_74);
    cleanUpBrokers(in_stack_ffffffffffffff30);
    std::shared_ptr<helics::Broker>::shared_ptr
              ((shared_ptr<helics::Broker> *)in_stack_ffffffffffffff30.__r,
               (shared_ptr<helics::Broker> *)
               CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
    in_stack_ffffffffffffff4f =
         gmlc::concurrency::SearchableObjectHolder<helics::Broker,_helics::CoreType>::addObject
                   (unaff_retaddr,in_RDI,(shared_ptr<helics::Broker> *)CONCAT44(in_ESI,uVar6),
                    type_00);
    uVar6 = (uint)(byte)in_stack_ffffffffffffff4f << 0x18;
    CLI::std::shared_ptr<helics::Broker>::~shared_ptr((shared_ptr<helics::Broker> *)0x4f7244);
  }
  bVar3 = (byte)(uVar6 >> 0x18);
  if ((uVar6 & 0x1000000) != 0) {
    in_stack_ffffffffffffff30.__r = (rep)&stack0xffffffffffffff68;
    std::shared_ptr<helics::Broker>::shared_ptr
              ((shared_ptr<helics::Broker> *)in_stack_ffffffffffffff30.__r,
               (shared_ptr<helics::Broker> *)
               CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
    gmlc::concurrency::DelayedDestructor<helics::Broker>::addObjectsToBeDestroyed
              (in_stack_ffffffffffffff50,
               (shared_ptr<helics::Broker> *)
               CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48));
    CLI::std::shared_ptr<helics::Broker>::~shared_ptr((shared_ptr<helics::Broker> *)0x4f72c0);
    addExtraTypes((string *)in_stack_ffffffffffffff30.__r,in_stack_ffffffffffffff2c);
  }
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffff30.__r);
  return (bool)(bVar3 & 1);
}

Assistant:

bool registerBroker(const std::shared_ptr<Broker>& broker, CoreType type)
{
    bool registered = false;
    const std::string& bname = (broker) ? broker->getIdentifier() : std::string{};
    if (broker) {
        registered = searchableBrokers.addObject(bname, broker, type);
    }
    if ((!registered) && (broker)) {
        std::this_thread::sleep_for(std::chrono::milliseconds(100));
        cleanUpBrokers(std::chrono::milliseconds(200));
        registered = searchableBrokers.addObject(bname, broker, type);
    }
    if (registered) {
        delayedDestroyer.addObjectsToBeDestroyed(broker);
        addExtraTypes(bname, type);
    }

    return registered;
}